

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

void __thiscall
helics::apps::Source::loadJsonFile
          (Source *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  value_t vVar1;
  _Map_pointer ppSVar2;
  _Map_pointer ppSVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  apps *paVar6;
  pointer pcVar7;
  SignalGenerator *pSVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  long *plVar11;
  bool bVar12;
  int iVar13;
  const_iterator cVar14;
  reference pvVar15;
  Time TVar16;
  Publication *__args;
  string *psVar17;
  mapped_type *pmVar18;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar19;
  const_reference pvVar20;
  string_type *psVar21;
  reference pbVar22;
  ostream *poVar23;
  SourceObject *pSVar24;
  int index;
  long lVar25;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view name;
  string_view generator;
  string_view type_00;
  string_view name_00;
  string_view name_01;
  json doc;
  iterator __end3_1;
  string key;
  value_type pubArray;
  value_type appConfig;
  value_type genArray;
  const_iterator __end6;
  value_type type;
  const_iterator __begin6;
  iterator __end3;
  data local_218;
  undefined1 local_208 [24];
  primitive_iterator_t local_1f0;
  string local_1e8;
  deque<helics::apps::SourceObject,std::allocator<helics::apps::SourceObject>> *local_1c8;
  string local_1c0;
  json_value local_1a0;
  _Rb_tree_node_base *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  long local_180;
  data local_130;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_120;
  data local_100;
  long *local_f0;
  SignalGenerator *local_e8;
  long local_e0 [2];
  Time *local_d0;
  const_iterator local_c8;
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a8;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a0;
  json_value prop;
  
  fileops::loadJson((fileops *)&local_218,(string *)jsonString);
  if ((local_218.m_type == object) &&
     (cVar14 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[7],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           *)local_218.m_value.object,(char (*) [7])0x430dca),
     (_Rb_tree_header *)cVar14._M_node !=
     &((local_218.m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_218,"source");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1a0,pvVar15);
    if ((local_1a0.boolean == true) &&
       (cVar14 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 ::_M_find_tr<char[14],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             *)local_198,(char (*) [14])"defaultperiod"),
       cVar14._M_node != (_Base_ptr)&local_198->_M_parent)) {
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_1a0.boolean,"defaultperiod");
      TVar16 = fileops::loadJsonTime(pvVar15,sec);
      (this->defaultPeriod).internalTimeCode = TVar16.internalTimeCode;
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_1a0);
  }
  local_1a0.object = (object_t *)&local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"source","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,(string *)&local_1a0,jsonString,enableFederateInterfaceRegistration);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.object != &local_190) {
    operator_delete(local_1a0.object,local_190._M_allocated_capacity + 1);
  }
  iVar13 = helics::ValueFederate::getPublicationCount
                     (&((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate);
  if (0 < iVar13) {
    local_1c8 = (deque<helics::apps::SourceObject,std::allocator<helics::apps::SourceObject>> *)
                &this->sources;
    local_d0 = &this->defaultPeriod;
    index = 0;
    do {
      __args = helics::ValueFederate::getPublication
                         (&((this->super_App).fed.
                            super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ValueFederate,index);
      std::deque<helics::apps::SourceObject,std::allocator<helics::apps::SourceObject>>::
      emplace_back<helics::Publication&,TimeRepresentation<count_time<9,long>>&>
                (local_1c8,__args,local_d0);
      ppSVar2 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppSVar3 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pSVar24 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      lVar25 = (long)pSVar24 -
               (long)(this->sources).
                     super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (lVar25 == 0) {
        pSVar24 = ppSVar2[-1] + 2;
      }
      pSVar4 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      pSVar5 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar17 = Interface::getName_abi_cxx11_((Interface *)(pSVar24 + -1));
      local_198 = (_Rb_tree_node_base *)(psVar17->_M_dataplus)._M_p;
      local_1a0 = (json_value)psVar17->_M_string_length;
      pmVar18 = CLI::std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ::operator[](&this->pubids,(key_type *)&local_1a0);
      *pmVar18 = (int)((ulong)lVar25 >> 8) +
                 ((int)((ulong)((long)ppSVar2 - (long)ppSVar3) >> 3) + -1 +
                 (uint)(ppSVar2 == (_Map_pointer)0x0)) * 2 +
                 (int)((ulong)((long)pSVar4 - (long)pSVar5) >> 8) + -1;
      index = index + 1;
    } while (iVar13 != index);
  }
  if ((local_218.m_type == object) &&
     (cVar14 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[13],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           *)local_218.m_value.object,(char (*) [13])0x4176c3),
     (_Rb_tree_header *)cVar14._M_node !=
     &((local_218.m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_218,"publications");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1c0,pvVar15);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_1a0,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_1c0);
    local_a0.anchor.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_a0.anchor.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_a0.anchor.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if ((char)local_1c0._M_dataplus._M_p == '\x02') {
      local_a0.anchor.m_it.array_iterator._M_current =
           *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             **)(local_1c0._M_string_length + 8);
    }
    else if ((char)local_1c0._M_dataplus._M_p == '\x01') {
      local_a0.anchor.m_it.object_iterator._M_node = (_Base_ptr)(local_1c0._M_string_length + 8);
    }
    else {
      local_a0.anchor.m_it.primitive_iterator.m_it = 1;
    }
    local_a0.anchor.m_object = (pointer)&local_1c0;
    while (bVar12 = nlohmann::json_abi_v3_11_3::detail::
                    iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    ::
                    operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                              ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)&local_1a0,
                               (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)&local_a0), !bVar12) {
      pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)&local_1a0);
      fileops::getName(&local_1e8,(json *)pbVar19);
      if ((*pbVar19 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (cVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[6],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [6])0x4446ec),
         sVar10 = local_1e8._M_string_length, _Var9._M_p = local_1e8._M_dataplus._M_p,
         cVar14._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
        pvVar20 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(pbVar19,"start");
        TVar16 = fileops::loadJsonTime(pvVar20,sec);
        key_00._M_str = _Var9._M_p;
        key_00._M_len = sVar10;
        setStartTime(this,key_00,TVar16);
      }
      if ((*pbVar19 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (cVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[7],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [7])0x425a10),
         sVar10 = local_1e8._M_string_length, _Var9._M_p = local_1e8._M_dataplus._M_p,
         cVar14._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
        pvVar20 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(pbVar19,"period");
        TVar16 = fileops::loadJsonTime(pvVar20,sec);
        key_01._M_str = _Var9._M_p;
        key_01._M_len = sVar10;
        setPeriod(this,key_01,TVar16);
      }
      if ((*pbVar19 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (cVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[10],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [10])"generator"),
         cVar14._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
        pvVar20 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(pbVar19,"generator");
        sVar10 = local_1e8._M_string_length;
        _Var9._M_p = local_1e8._M_dataplus._M_p;
        if ((byte)((pvVar20->m_data).m_type - number_integer) < 2) {
          pvVar20 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"generator");
          local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                    (pvVar20,(int *)local_208);
          key_02._M_str = _Var9._M_p;
          key_02._M_len = sVar10;
          linkPublicationToGenerator(this,key_02,local_208._0_4_);
        }
        else {
          pvVar20 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"generator");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_208,pvVar20);
          key_03._M_str = _Var9._M_p;
          key_03._M_len = sVar10;
          generator._M_str = (char *)local_208._0_8_;
          generator._M_len = local_208._8_8_;
          linkPublicationToGenerator(this,key_03,generator);
          if ((data *)local_208._0_8_ != (data *)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,(ulong)&((data *)local_208._16_8_)->field_0x1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(local_1a0.object)->_M_t)->_M_local_buf[0] == '\x02') {
        local_190._M_allocated_capacity = local_190._M_allocated_capacity + 0x10;
      }
      else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(local_1a0.object)->_M_t)->_M_local_buf[0] == '\x01') {
        local_198 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_198);
      }
      else {
        local_190._8_8_ = local_190._8_8_ + 1;
      }
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_1c0);
  }
  if ((local_218.m_type == object) &&
     (cVar14 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[11],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           *)local_218.m_value.object,(char (*) [11])"generators"),
     (_Rb_tree_header *)cVar14._M_node !=
     &((local_218.m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_218,"generators");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_130,pvVar15);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_1e8,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_130);
    local_1f0.m_it = -0x8000000000000000;
    local_208._16_8_ = (pointer)0x0;
    local_208._8_8_ = (_Base_ptr)0x0;
    if (local_130.m_type == array) {
      local_208._16_8_ =
           ((local_130.m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (local_130.m_type == object) {
      local_208._8_8_ = &((local_130.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_1f0.m_it = 1;
    }
    local_208._0_8_ = &local_130;
    while( true ) {
      bVar12 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)&local_1e8,
                          (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_208);
      if (bVar12) break;
      pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)&local_1e8);
      fileops::getName(&local_1c0,(json *)pbVar19);
      pvVar20 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(pbVar19,"type");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_100,pvVar20);
      sVar10 = local_1c0._M_string_length;
      if (local_100.m_type == null) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generator ",10);
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,
                                              (char)local_1c0._M_dataplus._M_p),
                             local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar23," does not specify a type\n",0x19);
      }
      else {
        name._M_str._1_7_ = local_1c0._M_dataplus._M_p._1_7_;
        name._M_str._0_1_ = (char)local_1c0._M_dataplus._M_p;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1a0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_100);
        name._M_len = sVar10;
        type_00._M_str = (char *)local_1a0.object;
        type_00._M_len = (size_t)local_198;
        prop = local_1a0;
        iVar13 = addSignalGenerator(this,name,type_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0.object != &local_190) {
          operator_delete(local_1a0.object,local_190._M_allocated_capacity + 1);
        }
        local_a8.container = (pointer)pbVar19;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::cbegin(&local_a0.anchor,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pbVar19);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    *)&local_1a0,&local_a0.anchor,0);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::end(&local_a0,&local_a8);
        local_1c8 = (deque<helics::apps::SourceObject,std::allocator<helics::apps::SourceObject>> *)
                    ((long)iVar13 << 4);
        while( true ) {
          bVar12 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_1a0,&local_a0.anchor);
          if (bVar12) break;
          psVar21 = nlohmann::json_abi_v3_11_3::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           *)&local_1a0);
          iVar13 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                             (psVar21,"type");
          if (iVar13 != 0) {
            psVar21 = nlohmann::json_abi_v3_11_3::detail::
                      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                      ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                             *)&local_1a0);
            iVar13 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                               (psVar21,"name");
            if (iVar13 != 0) {
              psVar21 = nlohmann::json_abi_v3_11_3::detail::
                        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               *)&local_1a0);
              iVar13 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (psVar21,"key");
              if (iVar13 != 0) {
                psVar21 = nlohmann::json_abi_v3_11_3::detail::
                          iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                 *)&local_1a0);
                iVar13 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (psVar21,"properties");
                if (iVar13 == 0) {
                  pbVar22 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&local_1a0);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::cbegin(&local_c8,pbVar22);
                  vVar1 = (pbVar22->m_data).m_type;
                  local_120.m_it.primitive_iterator.m_it = -0x8000000000000000;
                  local_120.m_it.array_iterator._M_current = (pointer)0x0;
                  local_120.m_it.object_iterator._M_node = (_Base_ptr)0x0;
                  local_120.m_object = pbVar22;
                  if (vVar1 == array) {
                    local_120.m_it.array_iterator._M_current =
                         (((pbVar22->m_data).m_value.array)->
                         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else if (vVar1 == object) {
                    local_120.m_it.object_iterator._M_node =
                         &(((pbVar22->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                          _M_header;
                  }
                  else {
                    local_120.m_it.primitive_iterator.m_it = 1;
                  }
                  while (bVar12 = nlohmann::json_abi_v3_11_3::detail::
                                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  ::
                                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                            (&local_c8,&local_120), !bVar12) {
                    pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::detail::
                                 iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 ::operator*(&local_c8);
                    if ((((*pbVar19 ==
                           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            )0x1) &&
                         (cVar14 = std::
                                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                   ::_M_find_tr<char[5],void>
                                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                                **)(pbVar19 + 8),(char (*) [5])0x42591b),
                         cVar14._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) &&
                        (*pbVar19 ==
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1)) &&
                       (cVar14 = std::
                                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                 ::_M_find_tr<char[6],void>
                                           (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                              **)(pbVar19 + 8),(char (*) [6])0x43c869),
                       cVar14._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
                      paVar6 = *(apps **)(local_1c8 +
                                         (long)(this->generators).
                                               super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                      pvVar20 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar19,"name");
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::
                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (&local_f0,pvVar20);
                      pSVar8 = local_e8;
                      plVar11 = local_f0;
                      pvVar20 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar19,"value");
                      name_01._M_str = (char *)pvVar20;
                      name_01._M_len = (size_t)plVar11;
                      setGeneratorProperty(paVar6,pSVar8,name_01,(json *)prop.object);
                      if (local_f0 != local_e0) {
                        operator_delete(local_f0,local_e0[0] + 1);
                      }
                    }
                    vVar1 = ((local_c8.m_object)->m_data).m_type;
                    if (vVar1 == array) {
                      local_c8.m_it.array_iterator._M_current =
                           local_c8.m_it.array_iterator._M_current + 1;
                    }
                    else if (vVar1 == object) {
                      local_c8.m_it.object_iterator._M_node =
                           (_Base_ptr)std::_Rb_tree_increment(local_c8.m_it.object_iterator._M_node)
                      ;
                    }
                    else {
                      local_c8.m_it.primitive_iterator.m_it =
                           local_c8.m_it.primitive_iterator.m_it + 1;
                    }
                  }
                }
                else {
                  paVar6 = *(apps **)(local_1c8 +
                                     (long)(this->generators).
                                           super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                  psVar21 = nlohmann::json_abi_v3_11_3::detail::
                            iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                   *)&local_1a0);
                  pcVar7 = (psVar21->_M_dataplus)._M_p;
                  pSVar8 = (SignalGenerator *)psVar21->_M_string_length;
                  pbVar22 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&local_1a0);
                  name_00._M_str = (char *)pbVar22;
                  name_00._M_len = (size_t)pcVar7;
                  setGeneratorProperty(paVar6,pSVar8,name_00,(json *)prop.object);
                }
              }
            }
          }
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(local_1a0.object)->_M_t)->_M_local_buf[0] == '\x02') {
            local_190._M_allocated_capacity = local_190._M_allocated_capacity + 0x10;
          }
          else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_1a0.object)->_M_t)->_M_local_buf[0] == '\x01') {
            local_198 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_198);
          }
          else {
            local_190._8_8_ = local_190._8_8_ + 1;
          }
          local_180 = local_180 + 1;
        }
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::~iteration_proxy_value(&local_a0);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    *)&local_1a0);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,(char)local_1c0._M_dataplus._M_p) !=
          &local_1c0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1c0._M_dataplus._M_p._1_7_,(char)local_1c0._M_dataplus._M_p),
                        local_1c0.field_2._M_allocated_capacity + 1);
      }
      if (*local_1e8._M_dataplus._M_p == '\x02') {
        local_1e8.field_2._M_allocated_capacity = local_1e8.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_1e8._M_dataplus._M_p == '\x01') {
        local_1e8._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_1e8._M_string_length);
      }
      else {
        local_1e8.field_2._8_8_ = local_1e8.field_2._8_8_ + 1;
      }
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_130);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_218);
  return;
}

Assistant:

void Source::loadJsonFile(const std::string& jsonString,
                              bool enableFederateInterfaceRegistration)
    {
        // we want to load the default period before constructing the interfaces so the default
        // period works
        auto doc = fileops::loadJson(jsonString);

        if (doc.contains("source")) {
            auto appConfig = doc["source"];
            if (appConfig.contains("defaultperiod")) {
                defaultPeriod = fileops::loadJsonTime(appConfig["defaultperiod"]);
            }
        }

        loadJsonFileConfiguration("source", jsonString, enableFederateInterfaceRegistration);
        auto pubCount = fed->getPublicationCount();
        for (int ii = 0; ii < pubCount; ++ii) {
            sources.emplace_back(fed->getPublication(ii), defaultPeriod);
            pubids[sources.back().pub.getName()] = static_cast<int>(sources.size()) - 1;
        }
        /* auto eptCount = fed->getEndpointCount();
     for (int ii = 0; ii < eptCount; ++ii)
     {
         endpoints.emplace_back(fed.get(), ii);
         eptids[endpoints.back().getName()] = static_cast<int> (endpoints.size() - 1);
     }
     */

        if (doc.contains("publications")) {
            auto pubArray = doc["publications"];

            for (const auto& pubElement : pubArray) {
                auto key = fileops::getName(pubElement);
                if (pubElement.contains("start")) {
                    setStartTime(key, fileops::loadJsonTime(pubElement["start"]));
                }
                if (pubElement.contains("period")) {
                    setPeriod(key, fileops::loadJsonTime(pubElement["period"]));
                }
                if (pubElement.contains("generator")) {
                    if (pubElement["generator"].is_number_integer()) {
                        linkPublicationToGenerator(key, pubElement["generator"].get<int>());
                    } else {
                        linkPublicationToGenerator(key, pubElement["generator"].get<std::string>());
                    }
                }
            }
        }
        if (doc.contains("generators")) {
            auto genArray = doc["generators"];
            for (const auto& genElement : genArray) {
                auto key = fileops::getName(genElement);
                auto type = genElement["type"];
                int index = -1;
                if (!type.is_null()) {
                    index = addSignalGenerator(key, type.get<std::string>());
                } else {
                    std::cout << "generator " << key << " does not specify a type\n";
                    continue;
                }
                for (auto& el : genElement.items()) {
                    if ((el.key() == "type") || (el.key() == "name") || (el.key() == "key")) {
                        continue;
                    }
                    if (el.key() == "properties") {
                        for (auto& prop : el.value()) {
                            if ((prop.contains("name")) && (prop.contains("value"))) {
                                setGeneratorProperty(generators[index].get(),
                                                     prop["name"].get<std::string>(),
                                                     prop["value"]);
                            }
                        }
                    } else {
                        setGeneratorProperty(generators[index].get(), el.key(), el.value());
                    }
                }
            }
        }
    }